

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall RefTable::AllocNodes(RefTable *this,SQUnsignedInteger size)

{
  void *pvVar1;
  SQObjectPtr *pSVar2;
  long in_RSI;
  long *in_RDI;
  SQUnsignedInteger n;
  RefNode *temp;
  RefNode *nodes;
  RefNode **bucks;
  ulong local_30;
  SQObjectPtr *local_28;
  
  pvVar1 = sq_vm_malloc(0x13f001);
  pSVar2 = (SQObjectPtr *)((long)pvVar1 + in_RSI * 8);
  local_28 = pSVar2;
  for (local_30 = 0; local_30 < in_RSI - 1U; local_30 = local_30 + 1) {
    *(undefined8 *)((long)pvVar1 + local_30 * 8) = 0;
    *(undefined8 *)&local_28[1].super_SQObject = 0;
    ::SQObjectPtr::SQObjectPtr(local_28);
    local_28[1].super_SQObject._unVal.pTable = (SQTable *)(local_28 + 2);
    local_28 = local_28 + 2;
  }
  *(undefined8 *)((long)pvVar1 + local_30 * 8) = 0;
  *(undefined8 *)&local_28[1].super_SQObject = 0;
  ::SQObjectPtr::SQObjectPtr(local_28);
  local_28[1].super_SQObject._unVal.pTable = (SQTable *)0x0;
  in_RDI[3] = (long)pSVar2;
  in_RDI[2] = (long)pSVar2;
  in_RDI[4] = (long)pvVar1;
  in_RDI[1] = 0;
  *in_RDI = in_RSI;
  return;
}

Assistant:

void RefTable::AllocNodes(SQUnsignedInteger size)
{
    RefNode **bucks;
    RefNode *nodes;
    bucks = (RefNode **)SQ_MALLOC((size * sizeof(RefNode *)) + (size * sizeof(RefNode)));
    nodes = (RefNode *)&bucks[size];
    RefNode *temp = nodes;
    SQUnsignedInteger n;
    for(n = 0; n < size - 1; n++) {
        bucks[n] = NULL;
        temp->refs = 0;
        new (&temp->obj) SQObjectPtr;
        temp->next = temp+1;
        temp++;
    }
    bucks[n] = NULL;
    temp->refs = 0;
    new (&temp->obj) SQObjectPtr;
    temp->next = NULL;
    _freelist = nodes;
    _nodes = nodes;
    _buckets = bucks;
    _slotused = 0;
    _numofslots = size;
}